

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O2

void __thiscall
arangodb::velocypack::Validator::validateCompactArray(Validator *this,uint8_t *ptr,size_t length)

{
  ValueLength VVar1;
  ValueLength VVar2;
  Exception *this_00;
  char *msg;
  uint8_t *puVar3;
  uint8_t *ptr_00;
  bool bVar4;
  uint8_t *local_40;
  uint8_t *local_38;
  
  validateBufferLength(this,4,length,true);
  local_40 = ptr + 1;
  VVar1 = ReadVariableLengthValue<false>(&local_40,ptr + length + 1);
  ptr_00 = local_40;
  if ((VVar1 <= length) && (3 < VVar1)) {
    local_40 = ptr + (VVar1 - 1);
    VVar1 = ReadVariableLengthValue<true>(&local_40,ptr + VVar1);
    if (VVar1 != 0) {
      puVar3 = local_40 + 1;
      while( true ) {
        bVar4 = VVar1 == 0;
        VVar1 = VVar1 - 1;
        if (bVar4) {
          return;
        }
        if (puVar3 <= ptr_00) break;
        validatePart(this,ptr_00,(long)puVar3 - (long)ptr_00,true);
        local_38 = ptr_00;
        VVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           &local_38);
        ptr_00 = ptr_00 + VVar2;
      }
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Array items number is out of bounds";
      goto LAB_00111cce;
    }
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  msg = "Array length value is out of bounds";
LAB_00111cce:
  Exception::Exception(this_00,ValidatorInvalidLength,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateCompactArray(uint8_t const* ptr, std::size_t length) {
  // compact Array without index table
  validateBufferLength(4, length, true);

  uint8_t const* p = ptr + 1;
  // read byteLength
  ValueLength const byteSize = ReadVariableLengthValue<false>(p, p + length);
  if (byteSize > length || byteSize < 4) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array length value is out of bounds");
  }

  // read nrItems
  uint8_t const* data = p;
  p = ptr + byteSize - 1;
  ValueLength nrItems = ReadVariableLengthValue<true>(p, ptr + byteSize);
  if (nrItems == 0) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array length value is out of bounds");
  }
  ++p;

  // validate the array members
  uint8_t const* e = p;
  p = data;
  while (nrItems-- > 0) {
    if (p >= e) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array items number is out of bounds");
    }
    validatePart(p, e - p, true);
    p += Slice(p).byteSize();
  }
}